

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

bool check_shield_block(CHAR_DATA *ch,CHAR_DATA *victim,int dt)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  OBJ_DATA *pOVar5;
  char *pcVar6;
  float fVar7;
  float local_243c;
  char buf2 [4608];
  char buf1 [4608];
  
  pOVar5 = get_eq_char(victim,0xb);
  if (((pOVar5 != (OBJ_DATA *)0x0) && (bVar1 = is_awake(victim), bVar1)) &&
     (iVar3 = get_skill(victim,(int)gsn_shield_block), 1 < iVar3)) {
    local_243c = (float)iVar3 * 0.25 + 15.0;
    iVar3 = get_skill(victim,(int)gsn_champions_defense);
    if (1 < iVar3) {
      iVar4 = number_percent();
      if ((double)iVar4 < (double)iVar3 * 0.85) {
        local_243c = local_243c + 25.0;
      }
      check_improve(victim,(int)gsn_champions_defense,(double)iVar4 < (double)iVar3 * 0.85,5);
    }
    bVar1 = is_npc(ch);
    if (((!bVar1) && (iVar3 = check_posture(ch), iVar3 == -1)) &&
       (bVar1 = style_check((int)gsn_posture,(int)ch->pcdata->style), bVar1)) {
      local_243c = local_243c + 20.0;
    }
    bVar1 = is_npc(victim);
    if (!bVar1) {
      iVar3 = check_posture(victim);
      if ((iVar3 == -1) && (bVar1 = style_check((int)gsn_posture,(int)victim->pcdata->style), bVar1)
         ) {
        local_243c = local_243c + 10.0;
      }
      iVar3 = check_posture(victim);
      if ((iVar3 == 1) && (bVar1 = style_check((int)gsn_posture,(int)victim->pcdata->style), bVar1))
      {
        local_243c = local_243c + -20.0;
      }
    }
    bVar1 = is_evil(victim);
    if (((bVar1) && (victim->level < ch->level)) && (bVar1 = is_affected(ch,(int)gsn_awe), bVar1)) {
      local_243c = local_243c + -20.0;
    }
    bVar1 = is_npc(victim);
    if ((bVar1) || (bVar1 = is_npc(ch), bVar1)) {
      local_243c = local_243c + (float)((int)victim->level - (int)ch->level);
    }
    sVar2 = get_hitroll(ch);
    fVar7 = (((float)(int)ch->balance +
             (((float)(int)sVar2 / -250.0 + 1.0) * local_243c - (float)(int)victim->balance)) -
            (float)(int)ch->batter) - (float)ch->analyze;
    if (victim->analyzePC == ch) {
      fVar7 = fVar7 + (float)victim->analyze;
    }
    bVar1 = check_entwine(victim,1);
    if (bVar1) {
      fVar7 = fVar7 * 0.5;
    }
    if (55.0 <= fVar7) {
      fVar7 = 55.0;
    }
    iVar3 = number_percent();
    if ((float)iVar3 < fVar7) {
      pcVar6 = get_attack_noun(ch,dt);
      sprintf(buf1,"You block $n\'s %s with your shield.",pcVar6);
      sprintf(buf2,"$N blocks your %s with $S shield.",pcVar6);
      if ((victim->wiznet[0] & 0x200000) != 0) {
        sprintf(buf1,"You block $n\'s %s with your shield. (%d%%)",pcVar6,(ulong)(uint)(int)fVar7);
      }
      if ((ch->wiznet[0] & 0x200000) != 0) {
        sprintf(buf2,"$N blocks your %s with $S shield. (%d%%)",pcVar6,(ulong)(uint)(int)fVar7);
      }
      act(buf1,ch,(void *)0x0,victim,2);
      act(buf2,ch,(void *)0x0,victim,3);
      check_improve(victim,(int)gsn_shield_block,true,4);
      bVar1 = is_npc(ch);
      if (bVar1) {
        if ((ch->progtypes[0] & 0x10) == 0) {
          return true;
        }
        bVar1 = str_cmp(ch->pIndexData->mprogs->fight_name,"fight_prog_barbarian");
        if (bVar1) {
          return true;
        }
      }
      else {
        bVar1 = style_check((int)gsn_batter,(int)ch->pcdata->style);
        if (!bVar1) {
          return true;
        }
      }
      check_batter(ch);
      return true;
    }
  }
  return false;
}

Assistant:

bool check_shield_block(CHAR_DATA *ch, CHAR_DATA *victim, int dt)
{
	int cd_sk = 0;
	float chance;
	char buf1[MAX_STRING_LENGTH];
	char buf2[MAX_STRING_LENGTH];
	char *attack;

	if (get_eq_char(victim, WEAR_SHIELD) == nullptr)
		return false;

	if (!is_awake(victim))
		return false;

    chance = get_skill(victim, gsn_shield_block);
	if (chance < 2)
		return false;

	chance /= 4;
	chance += 15;

	cd_sk = get_skill(victim, gsn_champions_defense);

	if (cd_sk > 1)
	{
		if (number_percent() < (cd_sk * .85))
		{
			chance += 25;
			check_improve(victim, gsn_champions_defense, true, 5);
		}
		else
		{
			check_improve(victim, gsn_champions_defense, false, 5);
		}
	}

	/* posture */
	if (!is_npc(ch))
	{
		if (check_posture(ch) == POSTURE_DEFENSE && style_check(gsn_posture, ch->pcdata->style))
			chance += 20;
	}

	if (!is_npc(victim))
	{
		if (check_posture(victim) == POSTURE_DEFENSE && style_check(gsn_posture, victim->pcdata->style))
			chance += 10;

		if (check_posture(victim) == POSTURE_OFFENSE && style_check(gsn_posture, victim->pcdata->style))
			chance -= 20;
	}

	if (is_evil(victim) && (ch->level > victim->level) && is_affected(ch, gsn_awe))
		chance -= 20;

	if (is_npc(victim) || is_npc(ch))
		chance += (victim->level - ch->level);

	chance *= (float)((float)1 - ((float)get_hitroll(ch) / (float)250));
	chance -= victim->balance;
	chance += ch->balance;
	chance -= ch->batter;
	chance -= ch->analyze;

	if (victim->analyzePC == ch)
		chance += victim->analyze;

	if (check_entwine(victim, 1))
		chance /= 2;

	chance = std::min((float)55, chance);

	if (number_percent() >= chance)
		return false;

	attack = get_dam_message(ch, dt);

	sprintf(buf1, "You block $n's %s with your shield.", attack);
	sprintf(buf2, "$N blocks your %s with $S shield.", attack);

	if (IS_SET(victim->wiznet, WIZ_PERCENT))
		sprintf(buf1, "You block $n's %s with your shield. (%d%%)", attack, (int)chance);

	if (IS_SET(ch->wiznet, WIZ_PERCENT))
		sprintf(buf2, "$N blocks your %s with $S shield. (%d%%)", attack, (int)chance);

	act(buf1, ch, 0, victim, TO_VICT);
	act(buf2, ch, 0, victim, TO_CHAR);
	check_improve(victim, gsn_shield_block, true, 4);

	/* Barbarian batter check */

	if (!is_npc(ch))
	{
		if (style_check(gsn_batter, ch->pcdata->style))
			check_batter(ch);
	}
	else if (IS_SET(ch->progtypes, MPROG_FIGHT) && !str_cmp(ch->pIndexData->mprogs->fight_name, "fight_prog_barbarian"))
	{
		check_batter(ch);
	}

	return true;
}